

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isDupColumn(Index *pIdx,int nKey,Index *pPk,int iCol)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  
  if (nKey < 1) {
    return 0;
  }
  uVar2 = 0;
  while (pIdx->aiColumn[uVar2] != pPk->aiColumn[iCol]) {
LAB_00199b36:
    uVar2 = uVar2 + 1;
    if (uVar2 == (uint)nKey) {
      return 0;
    }
  }
  lVar3 = 0;
  do {
    bVar1 = pIdx->azColl[uVar2][lVar3];
    if (bVar1 == pPk->azColl[iCol][lVar3]) {
      if ((ulong)bVar1 == 0) {
        return 1;
      }
    }
    else if (""[bVar1] != ""[(byte)pPk->azColl[iCol][lVar3]]) goto LAB_00199b36;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int isDupColumn(Index *pIdx, int nKey, Index *pPk, int iCol){
  int i, j;
  assert( nKey<=pIdx->nColumn );
  assert( iCol<MAX(pPk->nColumn,pPk->nKeyCol) );
  assert( pPk->idxType==SQLITE_IDXTYPE_PRIMARYKEY );
  assert( pPk->pTable->tabFlags & TF_WithoutRowid );
  assert( pPk->pTable==pIdx->pTable );
  testcase( pPk==pIdx );
  j = pPk->aiColumn[iCol];
  assert( j!=XN_ROWID && j!=XN_EXPR );
  for(i=0; i<nKey; i++){
    assert( pIdx->aiColumn[i]>=0 || j>=0 );
    if( pIdx->aiColumn[i]==j 
     && sqlite3StrICmp(pIdx->azColl[i], pPk->azColl[iCol])==0
    ){
      return 1;
    }
  }
  return 0;
}